

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

void cvarfunc_fluid_voices(FIntCVar *self)

{
  UCVarValue value;
  
  if (self->Value < 0x10) {
    value = (UCVarValue)0x10;
  }
  else {
    if (self->Value < 0x1001) {
      if (currSong != (MusInfo *)0x0) {
        (*currSong->_vptr_MusInfo[0x11])(currSong,"synth.polyphony");
        return;
      }
      return;
    }
    value = (UCVarValue)0x1000;
  }
  FBaseCVar::SetGenericRep(&self->super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }